

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O2

void __thiscall
summarycalc::reset_ssl_array(summarycalc *this,int summary_set,int sample_size,OASIS_FLOAT **ssl)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = this->max_summary_id_[summary_set];
  iVar2 = this->min_summary_id_[summary_set];
  iVar3 = this->num_idx_;
  for (lVar4 = 0; lVar4 <= (iVar1 - iVar2) + 1; lVar4 = lVar4 + 1) {
    for (lVar5 = 0; lVar5 <= (long)sample_size + (long)iVar3; lVar5 = lVar5 + 1) {
      ssl[lVar4][lVar5] = 0.0;
    }
  }
  return;
}

Assistant:

void summarycalc::reset_ssl_array(int summary_set, int sample_size, OASIS_FLOAT **ssl)
{
	int maxsummaryids = max_summary_id_[summary_set] - min_summary_id_[summary_set]+1;
	for (int i = 0; i <= maxsummaryids; i++) {
		for (int j = 0; j < sample_size + num_idx_ + 1; j++) {
			ssl[i][j] = 0;
		}
	}
}